

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall Assimp::SMDImporter::CreateOutputMeshes(SMDImporter *this)

{
  aiFace *paVar1;
  aiMatrix4x4 *paVar2;
  aiScene *paVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  aiBone *paVar7;
  Vertex *__n;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint iWeight;
  uint uVar21;
  pointer pbVar22;
  aiMesh **ppaVar23;
  ulong *puVar24;
  Logger *pLVar25;
  aiMesh *this_00;
  ulong uVar26;
  aiFace *paVar27;
  aiVector3D *paVar28;
  uint *puVar29;
  aiBone **ppaVar30;
  aiVertexWeight *__s;
  pointer pBVar31;
  pointer pbVar32;
  pointer pFVar33;
  uint uVar34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar35;
  uint iVert;
  long lVar36;
  ulong uVar37;
  pointer pBVar38;
  ulong uVar39;
  uint i;
  value_type_conflict4 local_cc;
  ulong *local_c8;
  aiBone *local_c0;
  ulong *local_b8;
  ulong local_b0;
  aiVector3D *local_a8;
  ulong local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  undefined1 local_90 [8];
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ulong local_70;
  aiVector3D *local_68;
  aiVector3D *local_60;
  aiMesh **local_58;
  ulong *local_50;
  ulong *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  ulong local_38;
  
  pbVar32 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar22 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar32 == pbVar22) {
    local_90 = (undefined1  [8])&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->aszTextures,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    pbVar32 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar22 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->pScene->mNumMeshes = (uint)((ulong)((long)pbVar22 - (long)pbVar32) >> 5);
  paVar3 = this->pScene;
  ppaVar23 = (aiMesh **)operator_new__((ulong)paVar3->mNumMeshes << 3);
  paVar3->mMeshes = ppaVar23;
  paVar3 = this->pScene;
  uVar21 = paVar3->mNumMeshes;
  lVar36 = (ulong)uVar21 * 0x18;
  puVar24 = (ulong *)operator_new__(lVar36 + 8);
  *puVar24 = (ulong)uVar21;
  pvVar35 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar24 + 1);
  if (uVar21 != 0) {
    uVar37 = lVar36 - 0x18;
    memset(pvVar35,0,(uVar37 - uVar37 % 0x18) + 0x18);
  }
  uVar39 = (ulong)paVar3->mNumMeshes;
  uVar37 = (((long)(this->asTriangles).
                   super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(this->asTriangles).
                  super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
                  super__Vector_impl_data._M_start) / 200 & 0xffffffffU) / uVar39;
  local_cc = (int)(uVar37 >> 1) + (int)uVar37;
  local_98 = pvVar35;
  for (uVar37 = 0; uVar37 < uVar39; uVar37 = uVar37 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvVar35,(ulong)local_cc);
    uVar39 = (ulong)this->pScene->mNumMeshes;
    pvVar35 = pvVar35 + 1;
  }
  local_cc = 0;
  pFVar33 = (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_50 = puVar24;
  do {
    if (pFVar33 ==
        (this->asTriangles).
        super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar37 = 0;
      while( true ) {
        puVar24 = local_50;
        pvVar35 = local_98;
        if (this->pScene->mNumMeshes <= (uint)uVar37) {
          if (*local_50 != 0) {
            lVar36 = *local_50 * 0x18;
            do {
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)puVar24 + lVar36 + -0x10));
              lVar36 = lVar36 + -0x18;
            } while (lVar36 != 0);
          }
          operator_delete__(puVar24);
          return;
        }
        local_70 = uVar37;
        this_00 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_00);
        ppaVar23 = this->pScene->mMeshes;
        uVar37 = local_70 & 0xffffffff;
        ppaVar23[uVar37] = this_00;
        puVar4 = pvVar35[uVar37].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar5 = pvVar35[uVar37].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar4 == puVar5) break;
        local_40 = pvVar35 + uVar37;
        this_00->mPrimitiveTypes = 4;
        ppaVar23[uVar37]->mNumVertices = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2) * 3;
        ppaVar23[uVar37]->mNumFaces =
             (uint)((ulong)((long)(local_40->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_40->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
        ppaVar23[uVar37]->mMaterialIndex = (uint)local_70;
        pBVar31 = (this->asBones).
                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar38 = (this->asBones).
                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_c8 = (ulong *)(((long)pBVar38 - (long)pBVar31) / 0x90);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_c8;
        uVar26 = SUB168(auVar8 * ZEXT816(0x18),0);
        uVar39 = uVar26 + 8;
        if (0xfffffffffffffff7 < uVar26) {
          uVar39 = 0xffffffffffffffff;
        }
        if (SUB168(auVar8 * ZEXT816(0x18),8) != 0) {
          uVar39 = 0xffffffffffffffff;
        }
        local_b0 = uVar37;
        local_48 = (ulong *)operator_new__(uVar39);
        local_b8 = local_48 + 1;
        *local_48 = (ulong)local_c8;
        if (pBVar38 != pBVar31) {
          lVar36 = 0;
          do {
            *(undefined8 *)((long)local_48 + lVar36 + 0x18) = 0;
            *(undefined8 *)((long)local_b8 + lVar36) = 0;
            ((undefined8 *)((long)local_b8 + lVar36))[1] = 0;
            lVar36 = lVar36 + 0x18;
          } while ((long)local_c8 * 0x18 - lVar36 != 0);
        }
        uVar21 = 0;
        while( true ) {
          uVar37 = ((long)pBVar38 - (long)pBVar31) / 0x90;
          if (uVar37 <= uVar21) break;
          std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)(local_b8 + (ulong)uVar21 * 3),ppaVar23[local_b0]->mNumVertices / uVar37);
          uVar21 = uVar21 + 1;
          pBVar31 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar38 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar37 = (ulong)ppaVar23[local_b0]->mNumFaces;
        puVar24 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
        paVar1 = (aiFace *)(puVar24 + 1);
        *puVar24 = uVar37;
        if (uVar37 != 0) {
          paVar27 = paVar1;
          do {
            paVar27->mNumIndices = 0;
            paVar27->mIndices = (uint *)0x0;
            paVar27 = paVar27 + 1;
          } while (paVar27 != paVar1 + uVar37);
        }
        ppaVar23[local_b0]->mFaces = paVar1;
        uVar21 = ppaVar23[local_b0]->mNumVertices;
        uVar37 = (ulong)uVar21 * 0xc;
        paVar28 = (aiVector3D *)operator_new__(uVar37);
        if ((ulong)uVar21 != 0) {
          uVar37 = uVar37 - 0xc;
          memset(paVar28,0,(uVar37 - uVar37 % 0xc) + 0xc);
        }
        uVar37 = local_b0;
        ppaVar23[local_b0]->mNormals = paVar28;
        uVar21 = ppaVar23[local_b0]->mNumVertices;
        local_c8 = (ulong *)((ulong)uVar21 * 0xc);
        local_60 = paVar28;
        paVar28 = (aiVector3D *)operator_new__((ulong)local_c8);
        if ((ulong)uVar21 != 0) {
          memset(paVar28,0,(((long)local_c8 - 0xcU) - ((long)local_c8 - 0xcU) % 0xc) + 0xc);
        }
        ppaVar23[uVar37]->mVertices = paVar28;
        local_68 = paVar28;
        if (this->bHasUVs == true) {
          uVar21 = ppaVar23[uVar37]->mNumVertices;
          local_c8 = (ulong *)((ulong)uVar21 * 0xc);
          paVar28 = (aiVector3D *)operator_new__((ulong)local_c8);
          if ((ulong)uVar21 != 0) {
            memset(paVar28,0,(((long)local_c8 - 0xcU) - ((long)local_c8 - 0xcU) % 0xc) + 0xc);
          }
          ppaVar23[uVar37]->mTextureCoords[0] = paVar28;
          ppaVar23[uVar37]->mNumUVComponents[0] = 2;
          local_a8 = paVar28;
        }
        else {
          local_a8 = (aiVector3D *)0x0;
        }
        local_cc = 0;
        uVar39 = 0;
        local_58 = ppaVar23;
        while (uVar39 < ppaVar23[uVar37]->mNumFaces) {
          puVar29 = (uint *)operator_new__(0xc);
          local_a0 = uVar39 * 0x10;
          ppaVar23[uVar37]->mFaces[uVar39].mIndices = puVar29;
          ppaVar23[uVar37]->mFaces[uVar39].mNumIndices = 3;
          uVar21 = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar39];
          pFVar33 = (this->asTriangles).
                    super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_68->z = pFVar33[uVar21].avVertices[0].pos.z;
          fVar12 = pFVar33[uVar21].avVertices[0].pos.y;
          local_68->x = pFVar33[uVar21].avVertices[0].pos.x;
          local_68->y = fVar12;
          local_68[1].z = pFVar33[uVar21].avVertices[1].pos.z;
          fVar12 = pFVar33[uVar21].avVertices[1].pos.y;
          local_68[1].x = pFVar33[uVar21].avVertices[1].pos.x;
          local_68[1].y = fVar12;
          local_68[2].z = pFVar33[uVar21].avVertices[2].pos.z;
          fVar12 = pFVar33[uVar21].avVertices[2].pos.y;
          local_68[2].x = pFVar33[uVar21].avVertices[2].pos.x;
          local_68[2].y = fVar12;
          local_60->z = pFVar33[uVar21].avVertices[0].nor.z;
          fVar12 = pFVar33[uVar21].avVertices[0].nor.y;
          local_60->x = pFVar33[uVar21].avVertices[0].nor.x;
          local_60->y = fVar12;
          fVar12 = pFVar33[uVar21].avVertices[1].nor.y;
          local_60[1].x = pFVar33[uVar21].avVertices[1].nor.x;
          local_60[1].y = fVar12;
          local_60[1].z = pFVar33[uVar21].avVertices[1].nor.z;
          fVar12 = pFVar33[uVar21].avVertices[2].nor.y;
          local_60[2].x = pFVar33[uVar21].avVertices[2].nor.x;
          local_60[2].y = fVar12;
          local_60[2].z = pFVar33[uVar21].avVertices[2].nor.z;
          if (local_a8 == (aiVector3D *)0x0) {
            local_a8 = (aiVector3D *)0x0;
          }
          else {
            local_a8->z = pFVar33[uVar21].avVertices[0].uv.z;
            fVar12 = pFVar33[uVar21].avVertices[0].uv.y;
            local_a8->x = pFVar33[uVar21].avVertices[0].uv.x;
            local_a8->y = fVar12;
            fVar12 = pFVar33[uVar21].avVertices[1].uv.y;
            local_a8[1].x = pFVar33[uVar21].avVertices[1].uv.x;
            local_a8[1].y = fVar12;
            local_a8[1].z = pFVar33[uVar21].avVertices[1].uv.z;
            fVar12 = pFVar33[uVar21].avVertices[2].uv.y;
            local_a8[2].x = pFVar33[uVar21].avVertices[2].uv.x;
            local_a8[2].y = fVar12;
            local_a8[2].z = pFVar33[uVar21].avVertices[2].uv.z;
            local_a8 = local_a8 + 3;
          }
          local_c0 = (aiBone *)pFVar33[uVar21].avVertices;
          local_68 = local_68 + 3;
          local_60 = local_60 + 3;
          local_38 = uVar39;
          for (lVar36 = 0; paVar7 = local_c0, lVar36 != 3; lVar36 = lVar36 + 1) {
            uVar21 = 0;
            local_c8 = (ulong *)((ulong)local_c8 & 0xffffffff00000000);
            while( true ) {
              ppaVar23 = local_58;
              uVar37 = local_b0;
              uVar39 = (ulong)uVar21;
              lVar6 = *(long *)&(((Vertex *)((long)paVar7 + lVar36 * 0x40))->aiBoneLinks).
                                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                ._M_impl.super__Vector_impl_data;
              if ((ulong)((long)*(pointer *)
                                 ((long)&(((Vertex *)((long)paVar7 + lVar36 * 0x40))->aiBoneLinks).
                                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                         ._M_impl + 8) - lVar6 >> 3) <= uVar39) break;
              uVar34 = *(uint *)(lVar6 + uVar39 * 8);
              if (((ulong)uVar34 <
                   (ulong)(((long)(this->asBones).
                                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->asBones).
                                 super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x90)) &&
                 (uVar34 != ((Vertex *)((long)paVar7 + lVar36 * 0x40))->iParentNode)) {
                local_90._4_4_ = *(float *)(lVar6 + 4 + uVar39 * 8);
                local_90._0_4_ = local_cc;
                std::
                vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                ::emplace_back<std::pair<unsigned_int,float>>
                          ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_b8 + (ulong)uVar34 * 3),(pair<unsigned_int,_float> *)local_90);
                local_c8 = (ulong *)CONCAT44(local_c8._4_4_,
                                             local_c8._0_4_ + *(float *)(lVar6 + 4 + uVar39 * 8));
              }
              else {
                pLVar25 = DefaultLogger::get();
                Logger::error(pLVar25,
                              "[SMD/VTA] Bone index overflow. The bone index will be ignored, the weight will be assigned to the vertex\' parent node"
                             );
              }
              uVar21 = uVar21 + 1;
            }
            if ((local_c8._0_4_ < 0.975) &&
               (uVar39 = (ulong)((Vertex *)((long)paVar7 + lVar36 * 0x40))->iParentNode,
               uVar39 != 0xffffffff)) {
              if (uVar39 < (ulong)(((long)(this->asBones).
                                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->asBones).
                                         super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x90)) {
                local_90._4_4_ = 1.0 - local_c8._0_4_;
                local_90._0_4_ = local_cc;
                std::
                vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                ::emplace_back<std::pair<unsigned_int,float>>
                          ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_b8 + uVar39 * 3),(pair<unsigned_int,_float> *)local_90);
              }
              else {
                pLVar25 = DefaultLogger::get();
                Logger::error(pLVar25,
                              "[SMD/VTA] Bone index overflow. The index of the vertex parent bone is invalid. The remaining weights will be normalized to 1.0"
                             );
                if ((local_c8._0_4_ != 0.0) || (NAN(local_c8._0_4_))) {
                  uVar21 = 0;
                  while( true ) {
                    lVar6 = *(long *)&(((Vertex *)((long)paVar7 + lVar36 * 0x40))->aiBoneLinks).
                                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                      ._M_impl.super__Vector_impl_data;
                    if ((ulong)((long)*(pointer *)
                                       ((long)&(((Vertex *)((long)paVar7 + lVar36 * 0x40))->
                                               aiBoneLinks).
                                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                               ._M_impl + 8) - lVar6 >> 3) <= (ulong)uVar21) break;
                    uVar39 = (ulong)*(uint *)(lVar6 + (ulong)uVar21 * 8);
                    if (uVar39 < (ulong)(((long)(this->asBones).
                                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->asBones).
                                               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x90)) {
                      *(float *)(local_b8[uVar39 * 3 + 1] - 4) =
                           *(float *)(local_b8[uVar39 * 3 + 1] - 4) * (1.0 / local_c8._0_4_);
                    }
                    uVar21 = uVar21 + 1;
                  }
                }
              }
            }
            *(value_type_conflict4 *)
             (*(long *)((long)&ppaVar23[uVar37]->mFaces->mIndices + local_a0) + lVar36 * 4) =
                 local_cc;
            local_cc = local_cc + 1;
          }
          uVar39 = local_38 + 1;
        }
        local_cc = 0;
        uVar21 = 0;
        for (uVar34 = 0; uVar39 = (ulong)uVar34,
            uVar39 < (ulong)(((long)(this->asBones).
                                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->asBones).
                                   super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x90);
            uVar34 = uVar34 + 1) {
          if (local_b8[uVar39 * 3] != local_b8[uVar39 * 3 + 1]) {
            uVar21 = uVar21 + 1;
            local_cc = uVar21;
          }
        }
        if (uVar21 != 0) {
          ppaVar23[uVar37]->mNumBones = uVar21;
          ppaVar30 = (aiBone **)operator_new__((ulong)ppaVar23[uVar37]->mNumBones << 3);
          ppaVar23[uVar37]->mBones = ppaVar30;
          local_cc = 0;
          for (uVar21 = 0; uVar39 = (ulong)uVar21,
              uVar39 < (ulong)(((long)(this->asBones).
                                      super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->asBones).
                                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x90);
              uVar21 = uVar21 + 1) {
            if (local_b8[uVar39 * 3] != local_b8[uVar39 * 3 + 1]) {
              local_c8 = local_b8 + uVar39 * 3;
              local_a0 = uVar39;
              local_c0 = (aiBone *)operator_new(0x450);
              aiBone::aiBone(local_c0);
              ppaVar30 = ppaVar23[uVar37]->mBones;
              uVar37 = (ulong)local_cc;
              ppaVar30[uVar37] = local_c0;
              local_c0->mNumWeights = (uint)(local_c8[1] - *local_c8 >> 3);
              uVar21 = ppaVar30[uVar37]->mNumWeights;
              local_c0 = (aiBone *)((ulong)uVar21 * 8);
              __s = (aiVertexWeight *)operator_new__((ulong)local_c0);
              if ((ulong)uVar21 != 0) {
                memset(__s,0,(size_t)local_c0);
              }
              uVar39 = local_a0;
              ppaVar30[uVar37]->mWeights = __s;
              pBVar31 = (this->asBones).
                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              paVar7 = ppaVar30[uVar37];
              paVar2 = &pBVar31[local_a0].mOffsetMatrix;
              fVar17 = paVar2->a1;
              fVar18 = paVar2->a2;
              fVar19 = paVar2->a3;
              fVar20 = paVar2->a4;
              pBVar38 = pBVar31 + local_a0;
              fVar15 = (pBVar38->mOffsetMatrix).b1;
              fVar16 = (pBVar38->mOffsetMatrix).b2;
              uVar9 = *(undefined8 *)(&(pBVar38->mOffsetMatrix).b1 + 2);
              pBVar38 = pBVar31 + local_a0;
              fVar13 = (pBVar38->mOffsetMatrix).c1;
              fVar14 = (pBVar38->mOffsetMatrix).c2;
              uVar10 = *(undefined8 *)(&(pBVar38->mOffsetMatrix).c1 + 2);
              pBVar31 = pBVar31 + local_a0;
              fVar12 = (pBVar31->mOffsetMatrix).d2;
              uVar11 = *(undefined8 *)(&(pBVar31->mOffsetMatrix).d1 + 2);
              (paVar7->mOffsetMatrix).d1 = (pBVar31->mOffsetMatrix).d1;
              (paVar7->mOffsetMatrix).d2 = fVar12;
              *(undefined8 *)&(paVar7->mOffsetMatrix).d3 = uVar11;
              (paVar7->mOffsetMatrix).c1 = fVar13;
              (paVar7->mOffsetMatrix).c2 = fVar14;
              *(undefined8 *)&(paVar7->mOffsetMatrix).c3 = uVar10;
              (paVar7->mOffsetMatrix).b1 = fVar15;
              (paVar7->mOffsetMatrix).b2 = fVar16;
              *(undefined8 *)&(paVar7->mOffsetMatrix).b3 = uVar9;
              (paVar7->mOffsetMatrix).a1 = fVar17;
              (paVar7->mOffsetMatrix).a2 = fVar18;
              (paVar7->mOffsetMatrix).a3 = fVar19;
              (paVar7->mOffsetMatrix).a4 = fVar20;
              pBVar31 = (this->asBones).
                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              __n = (Vertex *)pBVar31[local_a0].mName._M_string_length;
              if (__n < (Vertex *)0x400) {
                paVar7 = ppaVar30[uVar37];
                (paVar7->mName).length = (ai_uint32)__n;
                local_c0 = (aiBone *)__n;
                memcpy((paVar7->mName).data,pBVar31[local_a0].mName._M_dataplus._M_p,(size_t)__n);
                (paVar7->mName).data[(long)local_c0] = '\0';
                pBVar31 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                ppaVar23 = local_58;
              }
              uVar21 = (uint)local_a0;
              pBVar31[uVar39].bIsUsed = true;
              for (uVar39 = 0; uVar39 < ppaVar30[uVar37]->mNumWeights; uVar39 = uVar39 + 1) {
                ppaVar30[uVar37]->mWeights[uVar39].mVertexId = *(uint *)(*local_c8 + uVar39 * 8);
                ppaVar30[uVar37]->mWeights[uVar39].mWeight = *(float *)(*local_c8 + 4 + uVar39 * 8);
              }
              local_cc = local_cc + 1;
              uVar37 = local_b0;
            }
          }
        }
        puVar24 = local_48;
        if (*local_48 != 0) {
          lVar36 = *local_48 * 0x18;
          do {
            std::
            _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                             *)((long)puVar24 + lVar36 + -0x10));
            lVar36 = lVar36 + -0x18;
          } while (lVar36 != 0);
        }
        operator_delete__(puVar24);
        uVar37 = (ulong)((int)local_70 + 1);
      }
      __assert_fail("!aaiFaces[i].empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SMD/SMDLoader.cpp"
                    ,0x10c,"void Assimp::SMDImporter::CreateOutputMeshes()");
    }
    uVar37 = (ulong)pFVar33->iTexture;
    if (uVar37 == 0xffffffff) {
      local_90 = (undefined1  [8])((ulong)local_90 & 0xffffffff00000000);
      pvVar35 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar24 + 0x2fffffffe);
LAB_0051be1d:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (pvVar35,(uint *)local_90);
    }
    else {
      if ((ulong)((long)(this->aszTextures).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->aszTextures).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar37) {
        pLVar25 = DefaultLogger::get();
        Logger::info(pLVar25,"[SMD/VTA] Material index overflow in face");
        local_90._0_4_ =
             (int)((ulong)((long)(this->aszTextures).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->aszTextures).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
        pvVar35 = local_98 + pFVar33->iTexture;
        goto LAB_0051be1d;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (local_98 + uVar37,&local_cc);
    }
    pFVar33 = pFVar33 + 1;
    local_cc = local_cc + 1;
  } while( true );
}

Assistant:

void SMDImporter::CreateOutputMeshes() {
    if (aszTextures.empty()) {
        aszTextures.push_back(std::string());
    }

    // we need to sort all faces by their material index
    // in opposition to other loaders we can be sure that each
    // material is at least used once.
    pScene->mNumMeshes = (unsigned int) aszTextures.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    typedef std::vector<unsigned int> FaceList;
    FaceList* aaiFaces = new FaceList[pScene->mNumMeshes];

    // approximate the space that will be required
    unsigned int iNum = (unsigned int)asTriangles.size() / pScene->mNumMeshes;
    iNum += iNum >> 1;
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aaiFaces[i].reserve(iNum);
    }

    // collect all faces
    iNum = 0;
    for (std::vector<SMD::Face>::const_iterator
            iFace =  asTriangles.begin();
            iFace != asTriangles.end();++iFace,++iNum) {
        if (UINT_MAX == (*iFace).iTexture) {
            aaiFaces[(*iFace).iTexture].push_back( 0 );
        } else if ((*iFace).iTexture >= aszTextures.size()) {
            ASSIMP_LOG_INFO("[SMD/VTA] Material index overflow in face");
            aaiFaces[(*iFace).iTexture].push_back((unsigned int)aszTextures.size()-1);
        } else {
            aaiFaces[(*iFace).iTexture].push_back(iNum);
        }
    }

    // now create the output meshes
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh*& pcMesh = pScene->mMeshes[i] = new aiMesh();
        ai_assert(!aaiFaces[i].empty()); // should not be empty ...

        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        pcMesh->mNumVertices = (unsigned int)aaiFaces[i].size()*3;
        pcMesh->mNumFaces = (unsigned int)aaiFaces[i].size();
        pcMesh->mMaterialIndex = i;

        // storage for bones
        typedef std::pair<unsigned int,float> TempWeightListEntry;
        typedef std::vector< TempWeightListEntry > TempBoneWeightList;

        TempBoneWeightList* aaiBones = new TempBoneWeightList[asBones.size()]();

        // try to reserve enough memory without wasting too much
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            aaiBones[iBone].reserve(pcMesh->mNumVertices/asBones.size());
        }

        // allocate storage
        pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
        aiVector3D* pcNormals = pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcVerts = pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];

        aiVector3D* pcUVs = nullptr;
        if (bHasUVs) {
            pcUVs = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNumUVComponents[0] = 2;
        }

        iNum = 0;
        for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
            pcMesh->mFaces[iFace].mIndices = new unsigned int[3];
            pcMesh->mFaces[iFace].mNumIndices = 3;

            // fill the vertices
            unsigned int iSrcFace = aaiFaces[i][iFace];
            SMD::Face& face = asTriangles[iSrcFace];

            *pcVerts++ = face.avVertices[0].pos;
            *pcVerts++ = face.avVertices[1].pos;
            *pcVerts++ = face.avVertices[2].pos;

            // fill the normals
            *pcNormals++ = face.avVertices[0].nor;
            *pcNormals++ = face.avVertices[1].nor;
            *pcNormals++ = face.avVertices[2].nor;

            // fill the texture coordinates
            if (pcUVs) {
                *pcUVs++ = face.avVertices[0].uv;
                *pcUVs++ = face.avVertices[1].uv;
                *pcUVs++ = face.avVertices[2].uv;
            }

            for (unsigned int iVert = 0; iVert < 3;++iVert) {
                float fSum = 0.0f;
                for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone)  {
                    TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];

                    // FIX: The second check is here just to make sure we won't
                    // assign more than one weight to a single vertex index
                    if (pairval.first >= asBones.size() || pairval.first == face.avVertices[iVert].iParentNode) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The bone index will be ignored, the weight will be assigned "
                            "to the vertex' parent node");
                        continue;
                    }
                    aaiBones[pairval.first].push_back(TempWeightListEntry(iNum,pairval.second));
                    fSum += pairval.second;
                }
                // ******************************************************************
                // If the sum of all vertex weights is not 1.0 we must assign
                // the rest to the vertex' parent node. Well, at least the doc says
                // we should ...
                // FIX: We use 0.975 as limit, floating-point inaccuracies seem to
                // be very strong in some SMD exporters. Furthermore it is possible
                // that the parent of a vertex is 0xffffffff (if the corresponding
                // entry in the file was unreadable)
                // ******************************************************************
                if (fSum < 0.975f && face.avVertices[iVert].iParentNode != UINT_MAX) {
                    if (face.avVertices[iVert].iParentNode >= asBones.size()) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The index of the vertex parent bone is invalid. "
                            "The remaining weights will be normalized to 1.0");

                        if (fSum) {
                            fSum = 1 / fSum;
                            for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone) {
                                TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];
                                if (pairval.first >= asBones.size()) {
                                    continue;
                                }
                                aaiBones[pairval.first].back().second *= fSum;
                            }
                        }
                    } else {
                        aaiBones[face.avVertices[iVert].iParentNode].push_back(
                            TempWeightListEntry(iNum,1.0f-fSum));
                    }
                }
                pcMesh->mFaces[iFace].mIndices[iVert] = iNum++;
            }
        }

        // now build all bones of the mesh
        iNum = 0;
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            if (!aaiBones[iBone].empty())++iNum;
        }

        if (iNum) {
            pcMesh->mNumBones = iNum;
            pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
            iNum = 0;
            for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
                if (aaiBones[iBone].empty()) {
                    continue;
                }
                aiBone*& bone = pcMesh->mBones[iNum] = new aiBone();

                bone->mNumWeights = (unsigned int)aaiBones[iBone].size();
                bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                bone->mOffsetMatrix = asBones[iBone].mOffsetMatrix;
                bone->mName.Set( asBones[iBone].mName );

                asBones[iBone].bIsUsed = true;

                for (unsigned int iWeight = 0; iWeight < bone->mNumWeights;++iWeight) {
                    bone->mWeights[iWeight].mVertexId = aaiBones[iBone][iWeight].first;
                    bone->mWeights[iWeight].mWeight = aaiBones[iBone][iWeight].second;
                }
                ++iNum;
            }
        }
        delete[] aaiBones;
    }
    delete[] aaiFaces;
}